

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autowah.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_11e109::AutowahState::update
          (AutowahState *this,ALCcontext *context,EffectSlot *slot,EffectProps *props,
          EffectTarget target)

{
  pointer paVar1;
  undefined1 auVar2 [16];
  anon_struct_136_3_13600e2c *chan;
  MixParams *pMVar3;
  long lVar4;
  long lVar5;
  float fVar6;
  undefined1 auVar7 [16];
  EffectSlot *local_b0;
  MixParams *local_a8;
  RealMixParams *local_a0;
  undefined1 local_98 [16];
  float local_88;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  undefined1 local_68 [12];
  undefined8 uStack_5c;
  undefined8 local_54;
  undefined8 uStack_4c;
  undefined8 uStack_44;
  undefined4 uStack_3c;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined8 uStack_30;
  
  pMVar3 = target.Main;
  local_78 = (float)((context->mDevice).mPtr)->Frequency;
  fVar6 = 0.001;
  if (0.001 <= (props->Reverb).Diffusion) {
    fVar6 = (props->Reverb).Diffusion;
  }
  if (1.0 <= fVar6) {
    fVar6 = 1.0;
  }
  auVar7._4_4_ = fVar6 * local_78;
  auVar7._0_4_ = (props->Reverb).Density * local_78;
  auVar7._8_4_ = local_78 * 0.0;
  auVar7._12_4_ = local_78 * 0.0;
  local_98 = divps(_DAT_00170560,auVar7);
  fStack_74 = local_78;
  fStack_70 = local_78;
  fStack_6c = local_78;
  local_88 = expf(local_98._0_4_);
  fVar6 = expf((float)local_98._4_4_);
  this->mAttackRate = local_88;
  this->mReleaseRate = fVar6;
  fVar6 = log10f((props->Reverb).Gain);
  this->mResonanceGain = SQRT((fVar6 * 10.0) / 3.0);
  fVar6 = log10f((props->Reverb).GainHF / 31621.0);
  this->mPeakGain = 1.0 - fVar6;
  auVar2._4_4_ = fStack_74;
  auVar2._0_4_ = local_78;
  auVar2._8_4_ = fStack_70;
  auVar2._12_4_ = fStack_6c;
  auVar7 = divps(ZEXT816(0x451b000041a00000),auVar2);
  this->mFreqMinNorm = (float)(int)auVar7._0_8_;
  this->mBandwidthNorm = (float)(int)((ulong)auVar7._0_8_ >> 0x20);
  paVar1 = (pMVar3->Buffer).mDataEnd;
  (this->super_EffectState).mOutTarget.mData = (pMVar3->Buffer).mData;
  (this->super_EffectState).mOutTarget.mDataEnd = paVar1;
  lVar5 = (long)(slot->Wet).Buffer.mDataEnd - (long)(slot->Wet).Buffer.mData;
  if (lVar5 != 0) {
    uStack_34 = 0;
    uStack_30 = 0;
    uStack_44 = 0;
    uStack_3c = 0;
    local_38 = 0;
    local_54 = 0;
    uStack_4c = 0;
    local_68._4_8_ = 0;
    uStack_5c = 0;
    local_68._0_4_ = 0x3f800000;
    local_b0 = slot;
    local_a8 = pMVar3;
    local_a0 = target.RealOut;
    (anonymous_namespace)::AutowahState::
    update(ALCcontext_const*,EffectSlot_const*,EffectProps_const*,EffectTarget)::$_0::operator()
              (&local_b0,this->mChans,(span<const_float,_16UL>)local_68);
    chan = this->mChans;
    for (lVar4 = 0; chan = chan + 1, (lVar5 >> 0xc) + -1 != lVar4; lVar4 = lVar4 + 1) {
      *(undefined8 *)(local_68 + lVar4 * 4) = 0x3f80000000000000;
      (anonymous_namespace)::AutowahState::
      update(ALCcontext_const*,EffectSlot_const*,EffectProps_const*,EffectTarget)::$_0::operator()
                (&local_b0,chan,(span<const_float,_16UL>)local_68);
    }
  }
  return;
}

Assistant:

void AutowahState::update(const ALCcontext *context, const EffectSlot *slot,
    const EffectProps *props, const EffectTarget target)
{
    const ALCdevice *device{context->mDevice.get()};
    const auto frequency = static_cast<float>(device->Frequency);

    const float ReleaseTime{clampf(props->Autowah.ReleaseTime, 0.001f, 1.0f)};

    mAttackRate    = std::exp(-1.0f / (props->Autowah.AttackTime*frequency));
    mReleaseRate   = std::exp(-1.0f / (ReleaseTime*frequency));
    /* 0-20dB Resonance Peak gain */
    mResonanceGain = std::sqrt(std::log10(props->Autowah.Resonance)*10.0f / 3.0f);
    mPeakGain      = 1.0f - std::log10(props->Autowah.PeakGain/AL_AUTOWAH_MAX_PEAK_GAIN);
    mFreqMinNorm   = MIN_FREQ / frequency;
    mBandwidthNorm = (MAX_FREQ-MIN_FREQ) / frequency;

    mOutTarget = target.Main->Buffer;
    auto set_gains = [slot,target](auto &chan, al::span<const float,MAX_AMBI_CHANNELS> coeffs)
    { ComputePanGains(target.Main, coeffs.data(), slot->Gain, chan.TargetGains); };
    SetAmbiPanIdentity(std::begin(mChans), slot->Wet.Buffer.size(), set_gains);
}